

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

qint64 __thiscall QSslSocketPrivate::peek(QSslSocketPrivate *this,char *data,qint64 maxSize)

{
  QRingBufferRef *in_RDX;
  longlong in_RSI;
  char *in_RDI;
  qint64 r2;
  qint64 r;
  QRingBufferRef *local_40;
  qint64 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  QRingBufferRef *local_8;
  
  if ((*(int *)(in_RDI + 0x270) == 0) && ((in_RDI[0x274] & 1U) == 0)) {
    local_8 = (QRingBufferRef *)
              QIODevicePrivate::QRingBufferRef::peek
                        (in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(qint64)in_RDI);
    if (local_8 != in_RDX) {
      if (*(long *)(in_RDI + 0x3f8) == 0) {
        local_8 = (QRingBufferRef *)0xffffffffffffffff;
      }
      else {
        local_40 = (QRingBufferRef *)
                   QIODevice::peek(*(char **)(in_RDI + 0x3f8),(longlong)(local_8 + in_RSI));
        if ((long)local_40 < 0) {
          if (0 < (long)local_8) {
            local_40 = local_8;
          }
          local_8 = local_40;
        }
        else {
          local_8 = local_8 + (long)local_40;
        }
      }
    }
  }
  else {
    local_8 = (QRingBufferRef *)QIODevicePrivate::peek(in_RDI,in_RSI);
  }
  return (qint64)local_8;
}

Assistant:

qint64 QSslSocketPrivate::peek(char *data, qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        qint64 r = buffer.peek(data, maxSize, transactionPos);
        if (r == maxSize)
            return r;
        data += r;
        //peek at data in the plain socket
        if (plainSocket) {
            qint64 r2 = plainSocket->peek(data, maxSize - r);
            if (r2 < 0)
                return (r > 0 ? r : r2);
            return r + r2;
        }

        return -1;
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(data, maxSize);
    }
}